

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# segment_o1.cc
# Opt level: O0

MatrixXd * __thiscall
lf::geometry::SegmentO1::JacobianInverseGramian
          (MatrixXd *__return_storage_ptr__,SegmentO1 *this,MatrixXd *local)

{
  int iVar1;
  Index IVar2;
  ConstColXpr local_550;
  ConstColXpr local_518;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_2,_0,__1,_2>,__1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_2,_0,__1,_2>,__1,_1,_true>_>
  local_4e0;
  RealScalar local_468;
  ConstColXpr local_460;
  ConstColXpr local_428;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_2,_0,__1,_2>,__1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_2,_0,__1,_2>,__1,_1,_true>_>
  local_3f0;
  CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_2,_0,__1,_2>,__1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_2,_0,__1,_2>,__1,_1,_true>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  local_378;
  Replicate<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_2,_0,__1,_2>,__1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_2,_0,__1,_2>,__1,_1,_true>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,__1,__1>
  local_2d8;
  ConstColXpr local_228;
  ConstColXpr local_1f0;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_2,_0,__1,_2>,__1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_2,_0,__1,_2>,__1,_1,_true>_>
  local_1b8;
  CwiseInverseReturnType local_140;
  Replicate<Eigen::CwiseUnaryOp<Eigen::internal::scalar_inverse_op<double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_2,_0,__1,_2>,__1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_2,_0,__1,_2>,__1,_1,_true>_>_>,__1,__1>
  local_b8;
  PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *local_20;
  MatrixXd *local_local;
  SegmentO1 *this_local;
  
  local_20 = &local->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>;
  local_local = (MatrixXd *)this;
  this_local = (SegmentO1 *)__return_storage_ptr__;
  iVar1 = (*(this->super_Geometry)._vptr_Geometry[1])();
  if (iVar1 == 1) {
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_2,_0,_-1,_2>_>::col
              (&local_1f0,(DenseBase<Eigen::Matrix<double,__1,_2,_0,__1,_2>_> *)&this->coords_,1);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_2,_0,_-1,_2>_>::col
              (&local_228,(DenseBase<Eigen::Matrix<double,__1,_2,_0,__1,_2>_> *)&this->coords_,0);
    Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,2,0,-1,2>const,-1,1,true>>::operator-
              (&local_1b8,
               (MatrixBase<Eigen::Block<Eigen::Matrix<double,_1,2,0,_1,2>const,_1,1,true>> *)
               &local_1f0,
               (MatrixBase<Eigen::Block<const_Eigen::Matrix<double,__1,_2,_0,__1,_2>,__1,_1,_true>_>
                *)&local_228);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,_-1,_2,_0,_-1,_2>,_-1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,_-1,_2,_0,_-1,_2>,_-1,_1,_true>_>_>
    ::cwiseInverse(&local_140,
                   (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_2,_0,__1,_2>,__1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_2,_0,__1,_2>,__1,_1,_true>_>_>
                    *)&local_1b8);
    IVar2 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::cols(local_20);
    Eigen::
    DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_inverse_op<double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,_-1,_2,_0,_-1,_2>,_-1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,_-1,_2,_0,_-1,_2>,_-1,_1,_true>_>_>_>
    ::replicate(&local_b8,
                (DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_inverse_op<double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_2,_0,__1,_2>,__1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_2,_0,__1,_2>,__1,_1,_true>_>_>_>
                 *)&local_140,1,IVar2);
    Eigen::Matrix<double,-1,-1,0,-1,-1>::
    Matrix<Eigen::Replicate<Eigen::CwiseUnaryOp<Eigen::internal::scalar_inverse_op<double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,2,0,_1,2>const,_1,1,true>const,Eigen::Block<Eigen::Matrix<double,_1,2,0,_1,2>const,_1,1,true>const>const>,_1,_1>>
              ((Matrix<double,_1,_1,0,_1,_1> *)__return_storage_ptr__,
               (EigenBase<Eigen::Replicate<Eigen::CwiseUnaryOp<Eigen::internal::scalar_inverse_op<double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_2,_0,__1,_2>,__1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_2,_0,__1,_2>,__1,_1,_true>_>_>,__1,__1>_>
                *)&local_b8);
  }
  else {
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_2,_0,_-1,_2>_>::col
              (&local_428,(DenseBase<Eigen::Matrix<double,__1,_2,_0,__1,_2>_> *)&this->coords_,1);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_2,_0,_-1,_2>_>::col
              (&local_460,(DenseBase<Eigen::Matrix<double,__1,_2,_0,__1,_2>_> *)&this->coords_,0);
    Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,2,0,-1,2>const,-1,1,true>>::operator-
              (&local_3f0,
               (MatrixBase<Eigen::Block<Eigen::Matrix<double,_1,2,0,_1,2>const,_1,1,true>> *)
               &local_428,
               (MatrixBase<Eigen::Block<const_Eigen::Matrix<double,__1,_2,_0,__1,_2>,__1,_1,_true>_>
                *)&local_460);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_2,_0,_-1,_2>_>::col
              (&local_518,(DenseBase<Eigen::Matrix<double,__1,_2,_0,__1,_2>_> *)&this->coords_,1);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_2,_0,_-1,_2>_>::col
              (&local_550,(DenseBase<Eigen::Matrix<double,__1,_2,_0,__1,_2>_> *)&this->coords_,0);
    Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,2,0,-1,2>const,-1,1,true>>::operator-
              (&local_4e0,
               (MatrixBase<Eigen::Block<Eigen::Matrix<double,_1,2,0,_1,2>const,_1,1,true>> *)
               &local_518,
               (MatrixBase<Eigen::Block<const_Eigen::Matrix<double,__1,_2,_0,__1,_2>,__1,_1,_true>_>
                *)&local_550);
    local_468 = Eigen::
                MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,_-1,_2,_0,_-1,_2>,_-1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,_-1,_2,_0,_-1,_2>,_-1,_1,_true>_>_>
                ::squaredNorm((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_2,_0,__1,_2>,__1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_2,_0,__1,_2>,__1,_1,_true>_>_>
                               *)&local_4e0);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Block<Eigen::Matrix<double,-1,2,0,-1,2>const,-1,1,true>const,Eigen::Block<Eigen::Matrix<double,-1,2,0,-1,2>const,-1,1,true>const>>
    ::operator/(&local_378,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,2,0,_1,2>const,_1,1,true>const,Eigen::Block<Eigen::Matrix<double,_1,2,0,_1,2>const,_1,1,true>const>>
                 *)&local_3f0,&local_468);
    IVar2 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::cols(local_20);
    Eigen::
    DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,_-1,_2,_0,_-1,_2>,_-1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,_-1,_2,_0,_-1,_2>,_-1,_1,_true>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>_>
    ::replicate(&local_2d8,
                (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_2,_0,__1,_2>,__1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_2,_0,__1,_2>,__1,_1,_true>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
                 *)&local_378,1,IVar2);
    Eigen::Matrix<double,-1,-1,0,-1,-1>::
    Matrix<Eigen::Replicate<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,2,0,_1,2>const,_1,1,true>const,Eigen::Block<Eigen::Matrix<double,_1,2,0,_1,2>const,_1,1,true>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const>,_1,_1>>
              ((Matrix<double,_1,_1,0,_1,_1> *)__return_storage_ptr__,
               (EigenBase<Eigen::Replicate<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_2,_0,__1,_2>,__1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_2,_0,__1,_2>,__1,_1,_true>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,__1,__1>_>
                *)&local_2d8);
  }
  return __return_storage_ptr__;
}

Assistant:

Eigen::MatrixXd SegmentO1::JacobianInverseGramian(
    const Eigen::MatrixXd& local) const {
  if (DimGlobal() == 1) {
    return (coords_.col(1) - coords_.col(0))
        .cwiseInverse()
        .replicate(1, local.cols());
  }
  return ((coords_.col(1) - coords_.col(0)) /
          (coords_.col(1) - coords_.col(0)).squaredNorm())
      .replicate(1, local.cols());
}